

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnMemoryGrow(SharedValidator *this,Location *loc,Var *memidx)

{
  Result rhs;
  Var local_98;
  Enum local_4c;
  undefined1 local_48 [8];
  MemoryType mt;
  Var *memidx_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  Opcode::Opcode((Opcode *)&mt.limits.field_0x14,MemoryGrow);
  this_local._4_4_ = CheckInstr(this,(Opcode)mt.limits._20_4_,loc);
  MemoryType::MemoryType((MemoryType *)local_48);
  Var::Var(&local_98,memidx);
  local_4c = (Enum)CheckMemoryIndex(this,&local_98,(MemoryType *)local_48);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_4c);
  Var::~Var(&local_98);
  rhs = TypeChecker::OnMemoryGrow(&this->typechecker_,(Limits *)local_48);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnMemoryGrow(const Location& loc, Var memidx) {
  Result result = CheckInstr(Opcode::MemoryGrow, loc);
  MemoryType mt;
  result |= CheckMemoryIndex(memidx, &mt);
  result |= typechecker_.OnMemoryGrow(mt.limits);
  return result;
}